

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O2

void __thiscall DatasetBuilder::clear(DatasetBuilder *this)

{
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  *this_00;
  pointer pIVar1;
  runtime_error *this_01;
  pointer pIVar2;
  _Head_base<0UL,_BitmapIndexBuilder_*,_false> local_30;
  
  this_00 = &this->indices;
  std::
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  ::clear(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->fids);
  pIVar2 = (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar1 = (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pIVar2 == pIVar1) {
      return;
    }
    if (this->builder_type == BITMAP) {
      std::make_unique<BitmapIndexBuilder,IndexType_const&>((IndexType *)&local_30);
      std::
      vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
      ::emplace_back<std::unique_ptr<BitmapIndexBuilder,std::default_delete<BitmapIndexBuilder>>>
                ((vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
                  *)this_00,
                 (unique_ptr<BitmapIndexBuilder,_std::default_delete<BitmapIndexBuilder>_> *)
                 &local_30);
    }
    else {
      if (this->builder_type != FLAT) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"unhandled builder type");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::make_unique<FlatIndexBuilder,IndexType_const&>((IndexType *)&local_30);
      std::
      vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
      ::emplace_back<std::unique_ptr<FlatIndexBuilder,std::default_delete<FlatIndexBuilder>>>
                ((vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>
                  *)this_00,
                 (unique_ptr<FlatIndexBuilder,_std::default_delete<FlatIndexBuilder>_> *)&local_30);
    }
    if (local_30._M_head_impl != (BitmapIndexBuilder *)0x0) {
      (*((local_30._M_head_impl)->super_IndexBuilder)._vptr_IndexBuilder[1])();
    }
    pIVar2 = pIVar2 + 1;
  } while( true );
}

Assistant:

void DatasetBuilder::clear() {
    indices.clear();
    fids.clear();

    for (const auto &index_type : index_types) {
        if (builder_type == BuilderType::FLAT) {
            indices.emplace_back(
                std::make_unique<FlatIndexBuilder>(index_type));
        } else if (builder_type == BuilderType::BITMAP) {
            indices.emplace_back(
                std::make_unique<BitmapIndexBuilder>(index_type));
        } else {
            throw std::runtime_error("unhandled builder type");
        }
    }
}